

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

void makeTokenMap(UDataSwapper *ds,int16_t *tokens,uint16_t tokenCount,uint8_t *map,
                 UErrorCode *pErrorCode)

{
  UBool UVar1;
  byte local_13e;
  byte local_13d;
  ushort local_13c;
  ushort local_13a;
  char local_138 [2];
  uint8_t c2;
  uint8_t c1;
  uint16_t j;
  uint16_t i;
  UBool usedOutChar [256];
  UErrorCode *pErrorCode_local;
  uint8_t *map_local;
  uint16_t tokenCount_local;
  int16_t *tokens_local;
  UDataSwapper *ds_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (ds->inCharset == ds->outCharset) {
      for (local_13a = 0; local_13a < 0x100; local_13a = local_13a + 1) {
        map[local_13a] = (uint8_t)local_13a;
      }
    }
    else {
      memset(map,0,0x100);
      memset(local_138,0,0x100);
      map_local._6_2_ = tokenCount;
      if (0x100 < tokenCount) {
        map_local._6_2_ = 0x100;
      }
      for (local_13a = 1; local_13a < map_local._6_2_; local_13a = local_13a + 1) {
        if (tokens[local_13a] == -1) {
          local_13d = (byte)local_13a;
          (*ds->swapInvChars)(ds,&local_13d,1,&local_13e,pErrorCode);
          UVar1 = U_FAILURE(*pErrorCode);
          if (UVar1 != '\0') {
            udata_printError_63(ds,
                                "unames/makeTokenMap() finds variant character 0x%02x used (input charset family %d)\n"
                                ,(ulong)local_13a,(ulong)ds->inCharset);
            return;
          }
          map[local_13d] = local_13e;
          local_138[local_13e] = '\x01';
        }
      }
      local_13c = 1;
      for (local_13a = 1; local_13a < map_local._6_2_; local_13a = local_13a + 1) {
        if (map[local_13a] == '\0') {
          for (; local_138[local_13c] != '\0'; local_13c = local_13c + 1) {
          }
          map[local_13a] = (uint8_t)local_13c;
          local_13c = local_13c + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
makeTokenMap(const UDataSwapper *ds,
             int16_t tokens[], uint16_t tokenCount,
             uint8_t map[256],
             UErrorCode *pErrorCode) {
    UBool usedOutChar[256];
    uint16_t i, j;
    uint8_t c1, c2;

    if(U_FAILURE(*pErrorCode)) {
        return;
    }

    if(ds->inCharset==ds->outCharset) {
        /* Same charset family: identity permutation */
        for(i=0; i<256; ++i) {
            map[i]=(uint8_t)i;
        }
    } else {
        uprv_memset(map, 0, 256);
        uprv_memset(usedOutChar, 0, 256);

        if(tokenCount>256) {
            tokenCount=256;
        }

        /* set the direct bytes (byte 0 always maps to itself) */
        for(i=1; i<tokenCount; ++i) {
            if(tokens[i]==-1) {
                /* convert the direct byte character */
                c1=(uint8_t)i;
                ds->swapInvChars(ds, &c1, 1, &c2, pErrorCode);
                if(U_FAILURE(*pErrorCode)) {
                    udata_printError(ds, "unames/makeTokenMap() finds variant character 0x%02x used (input charset family %d)\n",
                                     i, ds->inCharset);
                    return;
                }

                /* enter the converted character into the map and mark it used */
                map[c1]=c2;
                usedOutChar[c2]=TRUE;
            }
        }

        /* set the mappings for the rest of the permutation */
        for(i=j=1; i<tokenCount; ++i) {
            /* set mappings that were not set for direct bytes */
            if(map[i]==0) {
                /* set an output byte value that was not used as an output byte above */
                while(usedOutChar[j]) {
                    ++j;
                }
                map[i]=(uint8_t)j++;
            }
        }

        /*
         * leave mappings at tokenCount and above unset if tokenCount<256
         * because they won't be used
         */
    }
}